

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_3U>::iterator::insert
          (iterator *this,unsigned_long left,unsigned_long right,monostate *value,
          allocator_type *alloc)

{
  Path *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  unsigned_long *puVar3;
  IntervalMap<unsigned_long,_std::monostate,_3U> *this_01;
  void *pvVar4;
  undefined8 uVar5;
  uint uVar6;
  IndexPair offset;
  uint uVar7;
  uint uVar8;
  uint32_t position;
  pointer pEVar9;
  uint uVar10;
  size_type sVar11;
  interval<unsigned_long> ival;
  interval<unsigned_long> local_30;
  
  this_01 = (this->super_const_iterator).map;
  this_00 = &(this->super_const_iterator).path;
  local_30.left = left;
  local_30.right = right;
  if (this_01->height == 0) {
    uVar6 = (this->super_const_iterator).path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
            [(this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].offset;
    position = 3;
    if ((ulong)uVar6 != 3) {
      uVar7 = this_01->rootSize;
      if (uVar6 != uVar7) {
        position = uVar6;
        uVar10 = uVar7;
        if (uVar7 == 3) goto LAB_0038957f;
        do {
          uVar8 = uVar10 - 1;
          puVar1 = (undefined8 *)((long)&this_01->field_0 + (ulong)uVar8 * 0x10);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&this_01->field_0 + (ulong)uVar10 * 0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          uVar10 = uVar8;
        } while (uVar6 != uVar8);
      }
      puVar3 = (unsigned_long *)((long)&this_01->field_0 + (ulong)uVar6 * 0x10);
      *puVar3 = left;
      puVar3[1] = right;
      uVar7 = uVar7 + 1;
      pEVar9 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      if (uVar7 < 4) {
        this_01->rootSize = uVar7;
        pEVar9->size = uVar7;
        return;
      }
      position = pEVar9[(this->super_const_iterator).path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                 offset;
    }
LAB_0038957f:
    offset = IntervalMap<unsigned_long,std::monostate,3u>::
             modifyRoot<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,3u,true>,slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>,true>
                       ((IntervalMap<unsigned_long,std::monostate,3u> *)this_01,
                        (LeafNode<unsigned_long,_std::monostate,_3U,_true> *)this_01,position,alloc)
    ;
    IntervalMapDetails::Path::
    replaceRoot<slang::IntervalMapDetails::BranchNode<unsigned_long,2u,true>>
              (this_00,(BranchNode<unsigned_long,_2U,_true> *)this_01,this_01->rootSize,offset);
  }
  sVar11 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if ((sVar11 == 0) ||
     (pEVar9 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar9->size <= pEVar9->offset)) {
    IntervalMapDetails::Path::legalizeForInsert(this_00,((this->super_const_iterator).map)->height);
    pEVar9 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    sVar11 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  }
  uVar6 = pEVar9[sVar11 - 1].offset;
  if ((ulong)uVar6 != 0xb) {
    uVar7 = pEVar9[sVar11 - 1].size;
    pvVar4 = pEVar9[sVar11 - 1].node;
    if (uVar6 != uVar7) {
      uVar10 = uVar7;
      if (uVar7 == 0xb) goto LAB_00389628;
      do {
        uVar8 = uVar10 - 1;
        puVar1 = (undefined8 *)((long)pvVar4 + (ulong)uVar8 * 0x10);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pvVar4 + (ulong)uVar10 * 0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        uVar10 = uVar8;
      } while (uVar6 != uVar8);
    }
    puVar3 = (unsigned_long *)((long)pvVar4 + (ulong)uVar6 * 0x10);
    *puVar3 = local_30.left;
    puVar3[1] = local_30.right;
    uVar7 = uVar7 + 1;
    sVar11 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    if (uVar7 < 0xc) goto LAB_0038969f;
  }
LAB_00389628:
  IntervalMap<unsigned_long,std::monostate,3u>::iterator::
  overflow<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
            ((iterator *)this,(int)sVar11 - 1,alloc);
  pEVar9 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar11 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  uVar6 = pEVar9[sVar11 - 1].offset;
  uVar7 = 0xc;
  if ((ulong)uVar6 != 0xb) {
    pvVar4 = pEVar9[sVar11 - 1].node;
    uVar10 = pEVar9[sVar11 - 1].size;
    if (uVar6 != uVar10) {
      uVar8 = uVar10;
      if (uVar10 == 0xb) goto LAB_0038969f;
      do {
        uVar7 = uVar8 - 1;
        puVar1 = (undefined8 *)((long)pvVar4 + (ulong)uVar7 * 0x10);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pvVar4 + (ulong)uVar8 * 0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        uVar8 = uVar7;
      } while (uVar6 != uVar7);
    }
    puVar3 = (unsigned_long *)((long)pvVar4 + (ulong)uVar6 * 0x10);
    *puVar3 = local_30.left;
    puVar3[1] = local_30.right;
    uVar7 = uVar10 + 1;
    sVar11 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  }
LAB_0038969f:
  uVar6 = (int)sVar11 - 1;
  pEVar9 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  pEVar9[uVar6].size = uVar7;
  if (uVar6 != 0) {
    uVar10 = (int)sVar11 - 2;
    *(ulong *)((long)pEVar9[uVar10].node + (ulong)pEVar9[uVar10].offset * 8) =
         *(ulong *)((long)pEVar9[uVar10].node + (ulong)pEVar9[uVar10].offset * 8) &
         0xffffffffffffffc0 | (ulong)(uVar7 - 1);
  }
  updateParentBounds(this,uVar6,&local_30);
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::insert(TKey left, TKey right, const TValue& value,
                                                    allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;

    interval<TKey> ival{left, right};
    if (this->isFlat()) {
        // Try simple root leaf insert first.
        uint32_t size = map.rootLeaf.insertFrom(path.leafOffset(), map.rootSize, ival, value);
        if (size <= RootLeaf::Capacity) {
            map.rootSize = size;
            path.setSize(0, size);
            return;
        }

        // Root is full, we need to branch.
        auto offset = map.switchToBranch(path.leafOffset(), alloc);
        path.replaceRoot(&map.rootBranch, map.rootSize, offset);
    }

    if (!path.valid())
        path.legalizeForInsert(this->map->height);

    uint32_t size = path.leafSize();
    size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), size, ival, value);

    if (size > Leaf::Capacity) {
        // If the new element didn't fit, overflow the node and try again.
        overflow<Leaf>(path.height(), alloc);
        size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), path.leafSize(), ival,
                                                     value);
    }

    // Update path to match the newly inserted element.
    path.setSize(path.height(), size);
    updateParentBounds(path.height(), ival);
}